

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

small_vector<double,_4UL,_0UL,_std::allocator<double>_> * __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::operator=
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,
          small_vector<double,_4UL,_0UL,_std::allocator<double>_> *v)

{
  double *pdVar1;
  double *pdVar2;
  size_t sVar3;
  double *pdVar4;
  
  if (this != v) {
    this->m_end = this->m_begin;
    pdVar2 = choose_data(this,(long)v->m_end - (long)v->m_begin >> 3);
    this->m_end = pdVar2;
    this->m_begin = pdVar2;
    pdVar1 = pdVar2;
    for (pdVar4 = v->m_begin; pdVar4 != v->m_end; pdVar4 = pdVar4 + 1) {
      *pdVar1 = *pdVar4;
      this->m_end = pdVar1 + 1;
      pdVar1 = pdVar1 + 1;
    }
    if ((type *)pdVar2 == this->m_static_data) {
      sVar3 = 4;
    }
    else {
      sVar3 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar3;
  }
  return this;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }